

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacProj.cpp
# Opt level: O2

void MacProj::Initialize(void)

{
  ostringstream *poVar1;
  int iVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  ParmParse pp;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  old_mac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> param;
  ParmParse local_260;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  allocator local_1d8 [32];
  Print local_1b8;
  
  if ((anonymous_namespace)::initialized == '\0') {
    (anonymous_namespace)::umac_periodic_test_Tol = 0x3ddb7cdfd9d7bdbb;
    verbose = 0;
    mac_tol = 1e-12;
    mac_abs_tol = 1e-16;
    mac_sync_tol = 1e-10;
    do_outflow_bcs = 1;
    check_umac_periodicity = 0;
    std::__cxx11::string::string((string *)&local_1b8,"mac_proj",(allocator *)&local_208);
    amrex::ParmParse::ParmParse(&local_260,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    amrex::ParmParse::query(&local_260,"verbose",&verbose,0);
    amrex::ParmParse::query(&local_260,"mac_tol",&mac_tol,0);
    amrex::ParmParse::query(&local_260,"mac_abs_tol",&mac_abs_tol,0);
    amrex::ParmParse::query(&local_260,"mac_sync_tol",&mac_sync_tol,0);
    amrex::ParmParse::query(&local_260,"do_outflow_bcs",&do_outflow_bcs,0);
    amrex::ParmParse::query(&local_260,"check_umac_periodicity",&check_umac_periodicity,0);
    amrex::ParmParse::query
              (&local_260,"umac_periodic_test_Tol",
               (double *)&(anonymous_namespace)::umac_periodic_test_Tol,0);
    amrex::ParmParse::query(&local_260,"agglomeration",&Initialize::agglomeration,0);
    amrex::ParmParse::query(&local_260,"consolidation",&Initialize::consolidation,0);
    amrex::ParmParse::query(&local_260,"max_fmg_iter",&Initialize::max_fmg_iter,0);
    amrex::ParmParse::query(&local_260,"maxorder",&Initialize::max_order,0);
    std::__cxx11::string::string((string *)&local_1b8,"v",(allocator *)&local_208);
    iVar2 = amrex::ParmParse::countname(&local_260,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    if (0 < iVar2) {
      amrex::Abort_host("mac_proj.v found in inputs. To set verbosity use mac_proj.verbose");
    }
    std::__cxx11::string::string((string *)&local_1b8,"mac",local_1d8);
    amrex::ParmParse::getEntries
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_208,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    if (local_208._M_impl.super__Rb_tree_header._M_node_count != 0) {
      poVar3 = amrex::OutStream();
      amrex::Print::Print(&local_1b8,poVar3);
      std::operator<<((ostream *)&local_1b8.ss,
                      "All runtime options related to the mac projection now use \'mac_proj\'.\n");
      std::operator<<((ostream *)&local_1b8.ss,
                      "Found these depreciated entries in the parameters list: \n");
      amrex::Print::~Print(&local_1b8);
      poVar1 = &local_1b8.ss;
      for (p_Var4 = local_208._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &local_208._M_impl.super__Rb_tree_header;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        std::__cxx11::string::string((string *)local_1d8,(string *)(p_Var4 + 1));
        poVar3 = amrex::OutStream();
        amrex::Print::Print(&local_1b8,poVar3);
        std::operator<<((ostream *)poVar1,"  ");
        std::operator<<((ostream *)poVar1,(string *)local_1d8);
        std::operator<<((ostream *)poVar1,"\n");
        amrex::Print::~Print(&local_1b8);
        std::__cxx11::string::~string((string *)local_1d8);
      }
      amrex::Abort_host("Replace \'mac\' prefix with \'mac_proj\' in inputs");
    }
    amrex::ExecOnFinalize((PTR_TO_VOID_FUNC)0x25e8a5);
    (anonymous_namespace)::initialized = '\x01';
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_208);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_260);
  }
  return;
}

Assistant:

void
MacProj::Initialize ()
{
    if (initialized) return;
    //
    // Set defaults here!!!
    //
    umac_periodic_test_Tol          = 1.e-10;
    MacProj::verbose                = 0;
    MacProj::mac_tol                = 1.0e-12;
    MacProj::mac_abs_tol            = 1.0e-16;
    MacProj::mac_sync_tol           = 1.0e-10;
    MacProj::do_outflow_bcs         = 1;
    //
    // Only check umac periodicity when debugging.  Can be overridden on input.
    //
#ifndef AMREX_DEBUG
    MacProj::check_umac_periodicity = 0;
#else
    MacProj::check_umac_periodicity = 1;
#endif

    // NOTE: IAMR uses a different max_order default than hydro::MacProjector,
    // which uses a default of 3
    static int max_order = 4;
    static int agglomeration = 1;
    static int consolidation = 1;
    static int max_fmg_iter = -1;


    ParmParse pp("mac_proj");

    pp.query("verbose",                verbose);
    pp.query("mac_tol",                mac_tol);
    pp.query("mac_abs_tol",            mac_abs_tol);
    pp.query("mac_sync_tol",           mac_sync_tol);
    pp.query("do_outflow_bcs",         do_outflow_bcs);
    pp.query("check_umac_periodicity", check_umac_periodicity);
    pp.query("umac_periodic_test_Tol", umac_periodic_test_Tol);

    pp.query("agglomeration", agglomeration);
    pp.query("consolidation", consolidation);
    pp.query("max_fmg_iter", max_fmg_iter);
    pp.query( "maxorder"      , max_order );
#ifdef AMREX_USE_HYPRE
    if ( pp.contains("use_hypre") )
      amrex::Abort("use_hypre is no more. To use Hypre set mac_proj.bottom_solver = hypre.");
    if ( pp.contains("hypre_verbose") )
      amrex::Abort("hypre_verbose is no more. To make the bottom solver verbose set mac_proj.bottom_verbose = 1.");
#endif

    // Abort if old verbose flag is found
    if ( pp.countname("v") > 0 ) {
	amrex::Abort("mac_proj.v found in inputs. To set verbosity use mac_proj.verbose");
    }
    // Abort if old "mac." prefix is used.
    std::set<std::string> old_mac = ParmParse::getEntries("mac");
    if (!old_mac.empty()){
	Print()<<"All runtime options related to the mac projection now use 'mac_proj'.\n"
	       <<"Found these depreciated entries in the parameters list: \n";
	for ( auto param : old_mac ) {
	    Print()<<"  "<<param<<"\n";
	}
	amrex::Abort("Replace 'mac' prefix with 'mac_proj' in inputs");
    }

    amrex::ExecOnFinalize(MacProj::Finalize);

    initialized = true;
}